

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidgetPrivate::emitItemEntered(QTableWidgetPrivate *this,QModelIndex *index)

{
  QTableModel *this_00;
  QTableWidgetItem *pQVar1;
  QModelIndex *in_RSI;
  QTableWidgetPrivate *in_RDI;
  QTableWidgetItem *item;
  QTableWidget *q;
  QTableWidgetItem *in_stack_ffffffffffffffc8;
  QModelIndex *in_stack_ffffffffffffffe0;
  
  this_00 = (QTableModel *)q_func(in_RDI);
  tableModel((QTableWidgetPrivate *)0x8d9940);
  pQVar1 = QTableModel::item(this_00,in_stack_ffffffffffffffe0);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    QTableWidget::itemEntered((QTableWidget *)0x8d9969,in_stack_ffffffffffffffc8);
  }
  QModelIndex::row(in_RSI);
  QModelIndex::column(in_RSI);
  QTableWidget::cellEntered((QTableWidget *)0x8d9999,(int)((ulong)this_00 >> 0x20),(int)this_00);
  return;
}

Assistant:

void QTableWidgetPrivate::emitItemEntered(const QModelIndex &index)
{
    Q_Q(QTableWidget);
    if (QTableWidgetItem *item = tableModel()->item(index))
        emit q->itemEntered(item);
    emit q->cellEntered(index.row(), index.column());
}